

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  Argument *pAVar3;
  bool local_8aa;
  bool local_7d1;
  string_view local_7d0;
  bool local_7b9;
  string_view local_7b8;
  bool local_7a1;
  string_view local_7a0;
  bool local_789;
  string_view local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  bool local_731;
  string_view local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  long local_6e0;
  ofstream outf;
  long local_4e0;
  ifstream inf;
  ostream *local_2d8;
  ostream *output;
  istream *input;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  undefined1 local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  runtime_error *err;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  any local_1e8;
  bool local_1d1;
  any local_1d0;
  bool local_1b9;
  any local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  bool local_179;
  any local_178;
  bool local_161;
  any local_160;
  allocator<char> local_149;
  string local_148;
  bool local_121;
  any local_120;
  bool local_109;
  any local_108;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  ArgumentParser program;
  char **argv_local;
  int argc_local;
  
  program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"cc0",&local_b9);
  argparse::ArgumentParser::ArgumentParser((ArgumentParser *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-s");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Translate the input c0 source code into a text assembly file",
             &local_f1);
  pAVar3 = argparse::Argument::help(pAVar3,&local_f0);
  local_109 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_108,&local_109);
  pAVar3 = argparse::Argument::default_value(pAVar3,&local_108);
  local_121 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_120,&local_121);
  argparse::Argument::implicit_value(pAVar3,&local_120);
  std::any::~any(&local_120);
  std::any::~any(&local_108);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-c");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Translate the input c0 source code into a binary object file",
             &local_149);
  pAVar3 = argparse::Argument::help(pAVar3,&local_148);
  local_161 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_160,&local_161);
  pAVar3 = argparse::Argument::default_value(pAVar3,&local_160);
  local_179 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_178,&local_179);
  argparse::Argument::implicit_value(pAVar3,&local_178);
  std::any::~any(&local_178);
  std::any::~any(&local_160);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-h");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"Shows help with compiler usage",&local_1a1);
  pAVar3 = argparse::Argument::help(pAVar3,&local_1a0);
  local_1b9 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1b8,&local_1b9);
  pAVar3 = argparse::Argument::default_value(pAVar3,&local_1b8);
  local_1d1 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1d0,&local_1d1);
  argparse::Argument::implicit_value(pAVar3,&local_1d0);
  std::any::~any(&local_1d0);
  std::any::~any(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"-o");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"out",&local_209);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_1e8,&local_208);
  pAVar3 = argparse::Argument::default_value(pAVar3,&local_1e8);
  pAVar3 = argparse::Argument::required(pAVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"specify the output file.",&local_231);
  argparse::Argument::help(pAVar3,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::any::~any(&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_98,"input");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"specify the input file.",(allocator<char> *)((long)&err + 7));
  argparse::Argument::help(pAVar3,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 7));
  argparse::ArgumentParser::parse_args
            ((ArgumentParser *)local_98,argc,
             (char **)program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&output_file.field_2 + 8),
             "input");
  argparse::ArgumentParser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
             (ArgumentParser *)local_98,stack0xfffffffffffffd68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&input,"-o");
  argparse::ArgumentParser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
             (ArgumentParser *)local_98,_input);
  std::ifstream::ifstream(&local_4e0);
  std::ofstream::ofstream(&local_6e0);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_288,"-");
  if (bVar1) {
    std::ifstream::open((string *)&local_4e0,(_Ios_Openmode)local_288);
    bVar2 = std::ios::operator!((ios *)((long)&local_4e0 + *(long *)(local_4e0 + -0x18)));
    if ((bVar2 & 1) != 0) {
      std::operator+(&local_720,"Fail to open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      std::operator+(&local_700,&local_720," for reading.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      exit(2);
    }
    output = (ostream *)&local_4e0;
  }
  else {
    output = (ostream *)&std::cin;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2b8,"-");
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_730,"-c");
    pAVar3 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_730);
    local_731 = true;
    bVar1 = argparse::Argument::operator==(pAVar3,&local_731);
    if (bVar1) {
      std::operator|(_S_bin,_S_trunc);
      std::ofstream::open((string *)&local_6e0,(_Ios_Openmode)local_2b8);
    }
    else {
      std::operator|(_S_out,_S_trunc);
      std::ofstream::open((string *)&local_6e0,(_Ios_Openmode)local_2b8);
    }
    bVar2 = std::ios::operator!((ios *)((long)&local_6e0 + *(long *)(local_6e0 + -0x18)));
    if ((bVar2 & 1) != 0) {
      std::operator+(&local_778,"Fail to open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_758,&local_778," for writing.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      exit(2);
    }
    local_2d8 = (ostream *)&local_6e0;
  }
  else {
    local_2d8 = (ostream *)&std::cout;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_788,"-s");
  pAVar3 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_788);
  local_789 = true;
  bVar1 = argparse::Argument::operator==(pAVar3,&local_789);
  local_8aa = false;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7a0,"-c");
    pAVar3 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_7a0);
    local_7a1 = true;
    local_8aa = argparse::Argument::operator==(pAVar3,&local_7a1);
  }
  if (local_8aa != false) {
    std::operator<<((ostream *)&std::cout,
                    "You can only perform tokenization or syntactic analysis at one time.");
    exit(2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7b8,"-s");
  pAVar3 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_7b8);
  local_7b9 = true;
  bVar1 = argparse::Argument::operator==(pAVar3,&local_7b9);
  if (bVar1) {
    assembler((istream *)output,local_2d8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d0,"-c");
    pAVar3 = argparse::ArgumentParser::operator[]((ArgumentParser *)local_98,local_7d0);
    local_7d1 = true;
    bVar1 = argparse::Argument::operator==(pAVar3,&local_7d1);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,"You must choose -c or -s.");
      exit(2);
    }
    compiler((istream *)output,local_2d8);
  }
  std::ofstream::~ofstream(&local_6e0);
  std::ifstream::~ifstream(&local_4e0);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_288);
  argparse::ArgumentParser::~ArgumentParser((ArgumentParser *)local_98);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argparse::ArgumentParser program("cc0");

	program.add_argument("-s")
		.help("Translate the input c0 source code into a text assembly file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-c")
		.help("Translate the input c0 source code into a binary object file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-h")
		.help("Shows help with compiler usage")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-o")
		.default_value(std::string("out"))
		.required()
		.help("specify the output file.");

	program.add_argument("input")
		.help("specify the input file.");


	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error & err) {
		std::cout << err.what() << std::endl;
		std::cout << program;
		exit(0);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("-o");
	std::istream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
	if (input_file != "-") {
		inf.open(input_file, std::ios::in);
		if (!inf) {
			std::cout << "Fail to open "+ input_file+" for reading.\n";
			exit(2);
		}
		input = &inf;
	}
	else
		input = &std::cin;
	if (output_file != "-") {
		if (program["-c"] == true) {
			outf.open(output_file, std::ios::binary| std::ios::trunc);
		}
		else {
			outf.open(output_file, std::ios::out | std::ios::trunc);
		}
		if (!outf) {
			std::cout << "Fail to open " + output_file + " for writing.\n";
			exit(2);
		}
		output = &outf;
	}
	else
		output = &std::cout;

	if (program["-s"] == true && program["-c"] == true) {
		std::cout << "You can only perform tokenization or syntactic analysis at one time.";
		exit(2);
	}
	if (program["-s"] == true) {
		assembler(*input, *output);
	}
	else if (program["-c"] == true) {
		compiler(*input, *output);
	}
	else {
		std::cout << "You must choose -c or -s.";
		exit(2);
	}

	return 0;
}